

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O0

void __thiscall kratos::SystemVerilogCodeGen::stmt_code(SystemVerilogCodeGen *this,SwitchStmt *stmt)

{
  initializer_list<const_kratos::IRNode_*> __l;
  pointer this_00;
  char cVar1;
  bool bVar2;
  bool bVar3;
  StatementType SVar4;
  basic_ostream<char,_std::char_traits<char>_> *pbVar5;
  ostream *poVar6;
  size_type __n;
  mapped_type *pmVar7;
  remove_reference_t<std::__cxx11::basic_string<char>_> *this_01;
  StmtBlock *pSVar8;
  uint64_t uVar9;
  element_type *this_02;
  element_type *peVar10;
  element_type *peVar11;
  element_type *peVar12;
  remove_reference_t<std::__cxx11::basic_string<char>_> *args;
  char (*format_str) [41];
  char *pcVar13;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view sVar14;
  format_args args_00;
  string_view format_str_00;
  undefined1 local_2a8 [24];
  undefined1 local_290 [32];
  undefined1 local_270 [16];
  SwitchStmt *local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_258;
  pointer local_248;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_240;
  shared_ptr<kratos::Var> local_228;
  string local_218;
  _Rb_tree_node_base local_1f8;
  byte local_1d3;
  allocator<char> local_1d2;
  byte local_1d1;
  shared_ptr<kratos::Var> local_1d0;
  string local_1c0;
  string_view local_1a0;
  _Self local_190;
  _Self local_188;
  __shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2> local_180;
  __shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2> *local_170;
  mapped_type *stmt_blk;
  shared_ptr<kratos::Const> *cond;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
  *__range1_1;
  shared_ptr<kratos::Const> *local_138;
  shared_ptr<kratos::Const> *local_130;
  reference local_128;
  pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_> *iter;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
  *__range1;
  vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_> conds;
  map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
  *body;
  undefined1 local_d8 [16];
  string local_c8;
  string_view local_a8;
  undefined8 local_98;
  SwitchStmt *stmt_local;
  SystemVerilogCodeGen *this_local;
  pointer local_80;
  basic_string_view<char> local_78;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_68;
  undefined1 local_50 [8];
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char *local_40;
  _Rb_tree_node_base *local_38;
  _Base_ptr local_30;
  element_type *local_28;
  element_type *local_20;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10;
  
  local_98 = stmt;
  stmt_local = (SwitchStmt *)this;
  local_a8 = indent(this);
  pbVar5 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                           &(this->stream_).super_stringstream.field_0x10,local_a8);
  pcVar13 = "";
  if (((this->options_).unique_case & 1U) != 0) {
    pcVar13 = "unique";
  }
  poVar6 = std::operator<<(pbVar5,pcVar13);
  poVar6 = std::operator<<(poVar6," case (");
  SwitchStmt::target((SwitchStmt *)local_d8);
  Stream::var_str_abi_cxx11_
            ((string *)(local_d8 + 0x10),&this->stream_,(shared_ptr<kratos::Var> *)local_d8);
  poVar6 = std::operator<<(poVar6,(string *)(local_d8 + 0x10));
  poVar6 = std::operator<<(poVar6,")");
  cVar1 = Stream::endl(&this->stream_);
  std::operator<<(poVar6,cVar1);
  std::__cxx11::string::~string((string *)(local_d8 + 0x10));
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_d8);
  this->indent_ = this->indent_ + 1;
  conds.
  super__Vector_base<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)SwitchStmt::body((SwitchStmt *)local_98);
  std::vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>::
  vector((vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_> *
         )&__range1);
  __n = std::
        map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
        ::size((map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
                *)conds.
                  super__Vector_base<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>::
  reserve((vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
           *)&__range1,__n);
  this_00 = conds.
            super__Vector_base<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  __end1 = std::
           map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
           ::begin((map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
                    *)conds.
                      super__Vector_base<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  iter = (pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_> *)
         std::
         map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
         ::end((map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
                *)this_00);
  while (bVar2 = std::operator!=(&__end1,(_Self *)&iter), bVar2) {
    local_128 = std::
                _Rb_tree_const_iterator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>
                ::operator*(&__end1);
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_128);
    if (bVar2) {
      std::vector<std::shared_ptr<kratos::Const>,std::allocator<std::shared_ptr<kratos::Const>>>::
      emplace_back<std::shared_ptr<kratos::Const>const&>
                ((vector<std::shared_ptr<kratos::Const>,std::allocator<std::shared_ptr<kratos::Const>>>
                  *)&__range1,&local_128->first);
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>
    ::operator++(&__end1);
  }
  local_130 = (shared_ptr<kratos::Const> *)
              std::
              vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
              ::begin((vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
                       *)&__range1);
  local_138 = (shared_ptr<kratos::Const> *)
              std::
              vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
              ::end((vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
                     *)&__range1);
  std::
  sort<__gnu_cxx::__normal_iterator<std::shared_ptr<kratos::Const>*,std::vector<std::shared_ptr<kratos::Const>,std::allocator<std::shared_ptr<kratos::Const>>>>,kratos::SystemVerilogCodeGen::stmt_code(kratos::SwitchStmt*)::__0>
            (local_130,local_138);
  __range1_1 = (vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
                *)0x0;
  std::vector<std::shared_ptr<kratos::Const>,std::allocator<std::shared_ptr<kratos::Const>>>::
  emplace_back<decltype(nullptr)>
            ((vector<std::shared_ptr<kratos::Const>,std::allocator<std::shared_ptr<kratos::Const>>>
              *)&__range1,&__range1_1);
  __end1_1 = std::
             vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
             ::begin((vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
                      *)&__range1);
  cond = (shared_ptr<kratos::Const> *)
         std::
         vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>::
         end((vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
              *)&__range1);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<std::shared_ptr<kratos::Const>_*,_std::vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>_>
                        *)&cond);
    if (!bVar2) {
      this->indent_ = this->indent_ - 1;
      sVar14 = indent(this);
      pbVar5 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                               &(this->stream_).super_stringstream.field_0x10,sVar14);
      poVar6 = std::operator<<(pbVar5,"endcase");
      cVar1 = Stream::endl(&this->stream_);
      std::operator<<(poVar6,cVar1);
      std::vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
      ::~vector((vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
                 *)&__range1);
      return;
    }
    stmt_blk = (mapped_type *)
               __gnu_cxx::
               __normal_iterator<std::shared_ptr<kratos::Const>_*,_std::vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>_>
               ::operator*(&__end1_1);
    local_188._M_node =
         (_Base_ptr)
         std::
         map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
         ::find((map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
                 *)conds.
                   super__Vector_base<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,(key_type *)stmt_blk);
    local_190._M_node =
         (_Base_ptr)
         std::
         map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
         ::end((map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
                *)conds.
                  super__Vector_base<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar2 = std::operator!=(&local_188,&local_190);
    if (bVar2) {
      pmVar7 = std::
               map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
               ::at((map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
                     *)conds.
                       super__Vector_base<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,(key_type *)stmt_blk);
      std::shared_ptr<kratos::ScopedStmtBlock>::shared_ptr
                ((shared_ptr<kratos::ScopedStmtBlock> *)&local_180,pmVar7);
    }
    else {
      std::shared_ptr<kratos::ScopedStmtBlock>::shared_ptr
                ((shared_ptr<kratos::ScopedStmtBlock> *)&local_180,(nullptr_t)0x0);
    }
    local_170 = &local_180;
    sVar14 = indent(this);
    local_1a0 = sVar14;
    pbVar5 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                             &(this->stream_).super_stringstream.field_0x10,sVar14);
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)stmt_blk);
    local_1d1 = 0;
    local_1d3 = 0;
    if (bVar2) {
      std::shared_ptr<kratos::Var>::shared_ptr<kratos::Const,void>
                (&local_1d0,(shared_ptr<kratos::Const> *)stmt_blk);
      local_1d1 = 1;
      Stream::var_str_abi_cxx11_(&local_1c0,&this->stream_,&local_1d0);
    }
    else {
      std::allocator<char>::allocator();
      local_1d3 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"default",&local_1d2);
    }
    poVar6 = std::operator<<(pbVar5,(string *)&local_1c0);
    std::operator<<(poVar6,": ");
    std::__cxx11::string::~string((string *)&local_1c0);
    if ((local_1d3 & 1) != 0) {
      std::allocator<char>::~allocator(&local_1d2);
    }
    if ((local_1d1 & 1) != 0) {
      std::shared_ptr<kratos::Var>::~shared_ptr(&local_1d0);
    }
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_170);
    if (bVar2) {
      pSVar8 = &std::
                __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_170)->super_StmtBlock;
      bVar2 = StmtBlock::empty(pSVar8);
      if (bVar2) {
        bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)stmt_blk);
        if (bVar2) {
          local_270[0xe] = '\x01';
          this_01 = (remove_reference_t<std::__cxx11::basic_string<char>_> *)
                    __cxa_allocate_exception(0x10);
          args = this_01;
          std::shared_ptr<kratos::Var>::shared_ptr<kratos::Const,void>
                    (&local_228,(shared_ptr<kratos::Const> *)stmt_blk);
          Stream::var_str_abi_cxx11_(&local_218,&this->stream_,&local_228);
          local_38 = &local_1f8;
          local_40 = "Switch statement condition {0} is empty!";
          vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_218;
          local_68._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               fmt::v7::make_args_checked<std::__cxx11::string,char[41],char>
                         ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)"Switch statement condition {0} is empty!",(v7 *)vargs,format_str,args)
          ;
          local_50 = (undefined1  [8])&local_68;
          local_78 = fmt::v7::to_string_view<char,_0>(local_40);
          local_28 = (element_type *)&this_local;
          local_30 = (_Base_ptr)local_50;
          local_20 = (element_type *)local_50;
          local_10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50;
          local_18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28;
          fmt::v7::
          basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          ::basic_format_args((basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                               *)local_28,0xd,
                              (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                               *)local_50);
          args_00.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.values_ = in_R9.values_;
          args_00.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)local_80;
          format_str_00.size_ = (size_t)this_local;
          format_str_00.data_ = (char *)local_78.size_;
          fmt::v7::detail::vformat_abi_cxx11_
                    ((string *)&local_1f8,(detail *)local_78.data_,format_str_00,args_00);
          local_260 = (SwitchStmt *)local_98;
          local_258._M_allocated_capacity =
               (size_type)
               std::__shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2> *)stmt_blk);
          local_258._8_8_ = &local_260;
          local_248 = (pointer)0x2;
          std::allocator<const_kratos::IRNode_*>::allocator
                    ((allocator<const_kratos::IRNode_*> *)(local_270 + 0xf));
          __l._M_len = (size_type)local_248;
          __l._M_array = (iterator)local_258._8_8_;
          std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                    (&local_240,__l,(allocator<const_kratos::IRNode_*> *)(local_270 + 0xf));
          VarException::VarException((VarException *)this_01,(string *)&local_1f8,&local_240);
          local_270[0xe] = '\0';
          __cxa_throw(this_01,&VarException::typeinfo,VarException::~VarException);
        }
      }
    }
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_170);
    if (bVar2) {
      pSVar8 = &std::
                __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_170)->super_StmtBlock;
      bVar2 = StmtBlock::empty(pSVar8);
      if (bVar2) {
        bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)stmt_blk);
        if (!bVar2) goto LAB_00390e18;
      }
      pSVar8 = &std::
                __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_170)->super_StmtBlock;
      local_2a8[0x17] = 0;
      uVar9 = StmtBlock::size(pSVar8);
      bVar2 = false;
      if (uVar9 == 1) {
        local_290._24_8_ =
             std::__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>::get(local_170);
        local_270._0_8_ =
             std::
             unordered_map<kratos::StmtBlock_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::StmtBlock_*>,_std::equal_to<kratos::StmtBlock_*>,_std::allocator<std::pair<kratos::StmtBlock_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(&this->label_index_,(key_type *)(local_290 + 0x18));
        local_290._16_8_ =
             std::
             unordered_map<kratos::StmtBlock_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::StmtBlock_*>,_std::equal_to<kratos::StmtBlock_*>,_std::allocator<std::pair<kratos::StmtBlock_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::end(&this->label_index_);
        bVar3 = std::__detail::operator==
                          ((_Node_iterator_base<std::pair<kratos::StmtBlock_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                            *)local_270,
                           (_Node_iterator_base<std::pair<kratos::StmtBlock_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                            *)(local_290 + 0x10));
        bVar2 = false;
        if (bVar3) {
          peVar10 = std::
                    __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_170);
          StmtBlock::get_stmt((StmtBlock *)local_290,(uint64_t)peVar10);
          local_2a8[0x17] = 1;
          this_02 = std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_290);
          SVar4 = Stmt::type(this_02);
          bVar2 = SVar4 == Assign;
        }
      }
      if ((local_2a8[0x17] & 1) != 0) {
        std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)local_290);
      }
      if (bVar2) {
        this->skip_indent_ = true;
        peVar10 = std::
                  __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator*((__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_170);
        StmtBlock::operator[]((StmtBlock *)local_2a8,(uint32_t)peVar10);
        peVar11 = std::__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>::get
                            ((__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)local_2a8);
        (**this->_vptr_SystemVerilogCodeGen)(this,peVar11);
        std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)local_2a8);
      }
      else {
        this->indent_ = this->indent_ + 1;
        peVar12 = std::__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>::get
                            (local_170);
        (**this->_vptr_SystemVerilogCodeGen)(this,peVar12);
        this->indent_ = this->indent_ - 1;
      }
    }
    else {
LAB_00390e18:
      poVar6 = std::operator<<((ostream *)&(this->stream_).super_stringstream.field_0x10,"begin end"
                              );
      cVar1 = Stream::endl(&this->stream_);
      std::operator<<(poVar6,cVar1);
    }
    std::shared_ptr<kratos::ScopedStmtBlock>::~shared_ptr
              ((shared_ptr<kratos::ScopedStmtBlock> *)&local_180);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<kratos::Const>_*,_std::vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>_>
    ::operator++(&__end1_1);
  } while( true );
}

Assistant:

void SystemVerilogCodeGen::stmt_code(SwitchStmt* stmt) {
    stream_ << indent() << (options_.unique_case ? "unique" : "") << " case ("
            << stream_.var_str(stmt->target()) << ")" << stream_.endl();
    indent_++;
    auto const& body = stmt->body();
    std::vector<std::shared_ptr<Const>> conds;
    conds.reserve(body.size());
    for (auto const& iter : body) {
        if (iter.first) conds.emplace_back(iter.first);
    }
    std::sort(conds.begin(), conds.end(),
              [](const auto& lhs, const auto& rhs) { return lhs->value() < rhs->value(); });
    conds.emplace_back(nullptr);

    for (auto& cond : conds) {
        const auto& stmt_blk = (body.find(cond) != body.end()) ? body.at(cond) : nullptr;
        stream_ << indent() << (cond ? stream_.var_str(cond) : "default") << ": ";
        if (stmt_blk && stmt_blk->empty() && cond) {
            throw VarException(
                ::format("Switch statement condition {0} is empty!", stream_.var_str(cond)),
                {stmt, cond.get()});
        } else if (!stmt_blk || (stmt_blk->empty() && !cond)) {
            //  empty default case
            stream_ << "begin end" << stream_.endl();
        } else {
            // directly output the code if the block only has 1 element
            if (stmt_blk->size() == 1 && label_index_.find(stmt_blk.get()) == label_index_.end() &&
                stmt_blk->get_stmt(0)->type() == StatementType::Assign) {
                skip_indent_ = true;
                dispatch_node((*stmt_blk)[0].get());
            } else {
                indent_++;
                dispatch_node(stmt_blk.get());
                indent_--;
            }
        }
    }

    indent_--;
    stream_ << indent() << "endcase" << stream_.endl();
}